

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_mon_base_pain(parser *p)

{
  uint uVar1;
  void *pvVar2;
  wchar_t pain_idx;
  monster_base *rb;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    uVar1 = parser_getuint(p,"pain");
    if ((int)uVar1 < (int)(uint)z_info->mp_max) {
      *(monster_pain **)((long)pvVar2 + 0x28) = pain_messages + (int)uVar1;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_OUT_OF_BOUNDS;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_mon_base_pain(struct parser *p) {
	struct monster_base *rb = parser_priv(p);
	int pain_idx;

	if (!rb)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	pain_idx = parser_getuint(p, "pain");
	if (pain_idx >= z_info->mp_max)
		return PARSE_ERROR_OUT_OF_BOUNDS;

	rb->pain = &pain_messages[pain_idx];

	return PARSE_ERROR_NONE;
}